

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O3

void ABC_ReleaseManager(ABC_Manager mng)

{
  Vec_Ptr_t *__ptr;
  Vec_Int_t *__ptr_00;
  
  ABC_TargetResFree(mng->pResult);
  if (mng->tNode2Name != (stmm_table *)0x0) {
    stmm_free_table(mng->tNode2Name);
  }
  if (mng->tName2Node != (stmm_table *)0x0) {
    stmm_free_table(mng->tName2Node);
  }
  if (mng->pMmNames != (Mem_Flex_t *)0x0) {
    Mem_FlexStop(mng->pMmNames,0);
  }
  if (mng->pNtk != (Abc_Ntk_t *)0x0) {
    Abc_NtkDelete(mng->pNtk);
  }
  if (mng->pTarget != (Abc_Ntk_t *)0x0) {
    Abc_NtkDelete(mng->pTarget);
  }
  __ptr = mng->vNodes;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
  }
  __ptr_00 = mng->vValues;
  if (__ptr_00 != (Vec_Int_t *)0x0) {
    if (__ptr_00->pArray != (int *)0x0) {
      free(__ptr_00->pArray);
    }
    free(__ptr_00);
  }
  if (mng->pDumpFileName != (char *)0x0) {
    free(mng->pDumpFileName);
  }
  free(mng);
  Abc_Stop();
  return;
}

Assistant:

void ABC_ReleaseManager( ABC_Manager mng )
{
    CSAT_Target_ResultT * p_res = ABC_Get_Target_Result( mng,0 );
    ABC_TargetResFree(p_res);
    if ( mng->tNode2Name ) stmm_free_table( mng->tNode2Name );
    if ( mng->tName2Node ) stmm_free_table( mng->tName2Node );
    if ( mng->pMmNames )   Mem_FlexStop( mng->pMmNames, 0 );
    if ( mng->pNtk )       Abc_NtkDelete( mng->pNtk );
    if ( mng->pTarget )    Abc_NtkDelete( mng->pTarget );
    if ( mng->vNodes )     Vec_PtrFree( mng->vNodes );
    if ( mng->vValues )    Vec_IntFree( mng->vValues );
    ABC_FREE( mng->pDumpFileName );
    ABC_FREE( mng );
    Abc_Stop();
}